

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined4 in_register_00000034;
  uint64_t *puVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  secp256k1_scalar s;
  secp256k1_scalar local_48;
  
  puVar7 = (uint64_t *)CONCAT44(in_register_00000034,len);
  uVar4 = 0;
  memset(wnaf,0,0x400);
  local_48.d[2] = puVar7[2];
  local_48.d[3] = puVar7[3];
  local_48.d[0] = *puVar7;
  local_48.d[1] = puVar7[1];
  iVar6 = 1;
  if ((long)puVar7[3] < 0) {
    secp256k1_scalar_negate(&local_48,&local_48);
    iVar6 = -1;
  }
  iVar1 = (int)a;
  uVar5 = 0xffffffff;
  uVar8 = 0;
  do {
    uVar10 = uVar8 >> 6;
    bVar2 = (byte)uVar8 & 0x3f;
    uVar9 = (uint)(local_48.d[uVar10] >> bVar2);
    if ((uVar9 & 1) == uVar4) {
      uVar9 = uVar8 + 1;
    }
    else {
      iVar3 = 0x100 - uVar8;
      if (iVar1 <= (int)(0x100 - uVar8)) {
        iVar3 = iVar1;
      }
      if ((uVar8 + iVar3) - 1 >> 6 != uVar10) {
        uVar9 = uVar9 | (uint)(local_48.d[(ulong)uVar10 + 1] << (-bVar2 & 0x3f));
      }
      uVar5 = uVar4 + (uVar9 & ~(uint)(-1L << ((byte)iVar3 & 0x3f)));
      uVar4 = (uint)((uVar5 >> (iVar1 - 1U & 0x1f) & 1) != 0);
      wnaf[(int)uVar8] = (uVar5 - (uVar4 << ((byte)a & 0x1f))) * iVar6;
      uVar9 = iVar3 + uVar8;
      uVar5 = uVar8;
    }
    uVar8 = uVar9;
  } while ((int)uVar8 < 0x100);
  return uVar5 + 1;
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    memset(wnaf, 0, len * sizeof(wnaf[0]));

    s = *a;
    if (secp256k1_scalar_get_bits(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    CHECK(carry == 0);
    while (bit < 256) {
        CHECK(secp256k1_scalar_get_bits(&s, bit++, 1) == 0);
    }
#endif
    return last_set_bit + 1;
}